

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext *ctx,ExprFunctionDefinition *node)

{
  uint uVar1;
  LLVMValueRefOpaque *pLVar2;
  VariableData *pVVar3;
  char *pcVar4;
  LLVMBasicBlockRefOpaque **ppLVar5;
  TypeBase *type;
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U> *this;
  int iVar6;
  undefined4 extraout_var;
  LLVMValueRefOpaque **ppLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FunctionData *pFVar8;
  ScopeData *pSVar9;
  VariableHandle *pVVar10;
  uint uVar11;
  ulong uVar12;
  ExprFunctionDefinition *pEVar13;
  ulong uVar14;
  LLVMValueRef pLVar15;
  ExprBase *expression;
  LLVMValueRef storage;
  LLVMValueRefOpaque *local_60;
  ExprFunctionDefinition *local_58;
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U> *local_50;
  LLVMValueRef local_48;
  FunctionData *pFStack_40;
  
  pFVar8 = node->function;
  if ((ctx->functions).count <= pFVar8->functionIndex) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<LLVMValueRefOpaque *, 128>::operator[](unsigned int) [T = LLVMValueRefOpaque *, N = 128]"
                 );
  }
  if (ctx->skipFunctionDefinitions == true) {
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,(node->super_ExprBase).type);
    pLVar15 = (LLVMValueRef)&placeholderValue;
    CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  }
  else if (pFVar8->isPrototype == false) {
    pLVar2 = (ctx->functions).data[pFVar8->functionIndex];
    ctx->skipFunctionDefinitions = true;
    local_48 = ctx->currentFunction;
    pFStack_40 = ctx->currentFunctionSource;
    ctx->currentFunction = pLVar2;
    ctx->currentFunctionSource = pFVar8;
    if (ctx->currentNextRestoreBlock != 0) {
      __assert_fail("ctx.currentNextRestoreBlock == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x6a9,
                    "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                   );
    }
    if ((ctx->currentRestoreBlocks).count != 0) {
      __assert_fail("ctx.currentRestoreBlocks.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x6aa,
                    "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                   );
    }
    pVVar10 = (pFVar8->argumentVariables).head;
    local_58 = node;
    if (pVVar10 != (VariableHandle *)0x0) {
      do {
        pVVar3 = pVVar10->variable;
        CompileLlvmType(ctx,pVVar3->type);
        pcVar4 = (pVVar3->name->name).begin;
        uVar14 = (long)(pVVar3->name->name).end - (long)pcVar4;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar14 + 1));
        uVar14 = uVar14 & 0xffffffff;
        memcpy((void *)CONCAT44(extraout_var,iVar6),pcVar4,uVar14);
        *(undefined1 *)((long)CONCAT44(extraout_var,iVar6) + uVar14) = 0;
        local_60 = (LLVMValueRefOpaque *)&placeholderValue;
        ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(&ctx->variables,&pVVar3->uniqueId);
        if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x6ca,
                        "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                       );
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (&ctx->variables,&pVVar3->uniqueId,&local_60);
        pVVar10 = pVVar10->next;
      } while (pVVar10 != (VariableHandle *)0x0);
      pFVar8 = local_58->function;
    }
    pEVar13 = local_58;
    pVVar3 = pFVar8->contextArgument;
    if (pVVar3 != (VariableData *)0x0) {
      CompileLlvmType(ctx,pVVar3->type);
      pcVar4 = (pVVar3->name->name).begin;
      uVar14 = (long)(pVVar3->name->name).end - (long)pcVar4;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar14 + 1));
      uVar14 = uVar14 & 0xffffffff;
      memcpy((void *)CONCAT44(extraout_var_00,iVar6),pcVar4,uVar14);
      *(undefined1 *)((long)CONCAT44(extraout_var_00,iVar6) + uVar14) = 0;
      local_60 = (LLVMValueRefOpaque *)&placeholderValue;
      CompileLlvmType(ctx,pEVar13->function->contextType);
      ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                ::find(&ctx->variables,&pVVar3->uniqueId);
      if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
        __assert_fail("!ctx.variables.find(variable->uniqueId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6da,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                (&ctx->variables,&pVVar3->uniqueId,&local_60);
      pFVar8 = pEVar13->function;
    }
    pSVar9 = pFVar8->functionScope;
    if ((pSVar9->allVariables).count != 0) {
      local_50 = &ctx->variables;
      uVar14 = 0;
      do {
        pVVar3 = (pSVar9->allVariables).data[uVar14];
        for (pVVar10 = (pFVar8->argumentVariables).head; pVVar10 != (VariableHandle *)0x0;
            pVVar10 = pVVar10->next) {
          if (pVVar3 == pVVar10->variable) goto LAB_00180dd7;
        }
        if (pVVar3 != pFVar8->contextArgument) {
          CompileLlvmType(ctx,pVVar3->type);
          pcVar4 = (pVVar3->name->name).begin;
          uVar12 = (long)(pVVar3->name->name).end - (long)pcVar4;
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar12 + 1));
          this = local_50;
          uVar12 = uVar12 & 0xffffffff;
          memcpy((void *)CONCAT44(extraout_var_01,iVar6),pcVar4,uVar12);
          *(undefined1 *)((long)CONCAT44(extraout_var_01,iVar6) + uVar12) = 0;
          local_60 = (LLVMValueRefOpaque *)&placeholderValue;
          ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                    ::find(this,&pVVar3->uniqueId);
          if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
            __assert_fail("!ctx.variables.find(variable->uniqueId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x6f4,
                          "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                         );
          }
          SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
          insert(this,&pVVar3->uniqueId,&local_60);
          pFVar8 = local_58->function;
          pEVar13 = local_58;
        }
LAB_00180dd7:
        uVar14 = uVar14 + 1;
        pSVar9 = pFVar8->functionScope;
      } while (uVar14 < (pSVar9->allVariables).count);
    }
    if (pFVar8->coroutine != false) {
      CompileLlvm(ctx,pEVar13->coroutineStateRead);
      pFVar8 = pEVar13->function;
      if (pFVar8->yieldCount != 0) {
        uVar11 = 0;
        do {
          CompileLlvmType(ctx,ctx->ctx->typeInt);
          uVar1 = (ctx->currentRestoreBlocks).count;
          if (uVar1 == (ctx->currentRestoreBlocks).max) {
            SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::grow(&ctx->currentRestoreBlocks,uVar1);
          }
          ppLVar5 = (ctx->currentRestoreBlocks).data;
          if (ppLVar5 == (LLVMBasicBlockRefOpaque **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<LLVMBasicBlockRefOpaque *, 16>::push_back(const T &) [T = LLVMBasicBlockRefOpaque *, N = 16]"
                         );
          }
          uVar11 = uVar11 + 1;
          uVar1 = (ctx->currentRestoreBlocks).count;
          (ctx->currentRestoreBlocks).count = uVar1 + 1;
          ppLVar5[uVar1] = (LLVMBasicBlockRefOpaque *)&placeholderBasicBlock;
          pFVar8 = pEVar13->function;
        } while (uVar11 < pFVar8->yieldCount);
      }
    }
    expression = (pEVar13->expressions).head;
    if (expression != (ExprBase *)0x0) {
      do {
        CompileLlvm(ctx,expression);
        expression = expression->next;
      } while (expression != (ExprBase *)0x0);
      pFVar8 = pEVar13->function;
    }
    type = pFVar8->type->returnType;
    if (type != ctx->ctx->typeVoid) {
      CompileLlvmType(ctx,type);
    }
    ctx->currentFunction = local_48;
    ctx->currentFunctionSource = pFStack_40;
    pLVar15 = (LLVMValueRef)0x0;
    ctx->currentNextRestoreBlock = 0;
    (ctx->currentRestoreBlocks).count = 0;
    ctx->skipFunctionDefinitions = false;
  }
  else {
    pLVar15 = (LLVMValueRef)0x0;
  }
  return pLVar15;
}

Assistant:

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &ctx, ExprFunctionDefinition *node)
{
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	if(ctx.skipFunctionDefinitions)
	{
		LLVMValueRef function = LLVMBuildPointerCast(ctx.builder, ctx.functions[node->function->functionIndex], CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

		LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

		LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

		result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

		return CheckType(ctx, node, result);
	}

	if(node->function->isPrototype)
		return NULL;

	ctx.skipFunctionDefinitions = true;

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = node->function;

	assert(ctx.currentNextRestoreBlock == 0);
	assert(ctx.currentRestoreBlocks.empty());

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Allocate all arguments
	unsigned argIndex = 0;

	if(IsStructReturnType(node->function->type->returnType))
		argIndex++;

	for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		if(IsStructArgumentType(variable->type))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, argument);
		}
		else
		{
			LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, argument, storage);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, storage);
		}
	}

	if(VariableData *variable = node->function->contextArgument)
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, node->function->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, storage);

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	// Generate variables for all locals
	for(unsigned i = 0; i < node->function->functionScope->allVariables.size(); i++)
	{
		VariableData *variable = node->function->functionScope->allVariables[i];

		bool isArgument = false;

		for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
		{
			if(variable == curr->variable)
			{
				isArgument = true;
				break;
			}
		}

		if(isArgument || variable == node->function->contextArgument)
			continue;

		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	if(node->function->coroutine)
	{
		LLVMValueRef state = CompileLlvm(ctx, node->coroutineStateRead);

		LLVMBasicBlockRef startBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMValueRef switchInst = LLVMBuildSwitch(ctx.builder, state, startBlock, node->function->yieldCount);

		LLVMPositionBuilderAtEnd(ctx.builder, startBlock);

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			LLVMBasicBlockRef restoreBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "restore");

			LLVMAddCase(switchInst, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), i + 1, true), restoreBlock);

			ctx.currentRestoreBlocks.push_back(restoreBlock);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmAbortNoReturn"), NULL, 0, "");

	if(node->function->type->returnType == ctx.ctx.typeVoid || IsStructReturnType(node->function->type->returnType))
		LLVMBuildRetVoid(ctx.builder);
	else
		LLVMBuildRet(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, node->function->type->returnType)));

	CheckFunction(ctx, ctx.currentFunction, node->function->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	ctx.currentNextRestoreBlock = 0;
	ctx.currentRestoreBlocks.clear();

	ctx.skipFunctionDefinitions = false;

	return NULL;
}